

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCompoundCollisionAlgorithm.cpp
# Opt level: O2

btScalar __thiscall
btCompoundCollisionAlgorithm::calculateTimeOfImpact
          (btCompoundCollisionAlgorithm *this,btCollisionObject *body0,btCollisionObject *body1,
          btDispatcherInfo *dispatchInfo,btManifoldResult *resultOut)

{
  btTransform *pbVar1;
  btVector3 *pbVar2;
  btVector3 *pbVar3;
  btVector3 *pbVar4;
  uint uVar5;
  btCollisionShape *pbVar6;
  btCollisionAlgorithm *pbVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  btCollisionObject *pbVar11;
  btScalar bVar12;
  float extraout_XMM0_Da;
  float fVar13;
  btTransform orgTrans;
  btTransform local_b8;
  btTransform local_70;
  
  pbVar11 = body1;
  if (this->m_isSwapped != false) {
    pbVar11 = body0;
    body0 = body1;
  }
  pbVar6 = body0->m_collisionShape;
  uVar5 = (this->m_childCollisionAlgorithms).m_size;
  pbVar1 = &body0->m_worldTransform;
  pbVar2 = (body0->m_worldTransform).m_basis.m_el + 1;
  pbVar3 = (body0->m_worldTransform).m_basis.m_el + 2;
  pbVar4 = &(body0->m_worldTransform).m_origin;
  uVar10 = 0;
  uVar8 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar8 = uVar10;
  }
  bVar12 = 1.0;
  for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
    local_b8.m_basis.m_el[0].m_floats._0_8_ = *(undefined8 *)(pbVar1->m_basis).m_el[0].m_floats;
    local_b8.m_basis.m_el[0].m_floats._8_8_ =
         *(undefined8 *)((body0->m_worldTransform).m_basis.m_el[0].m_floats + 2);
    local_b8.m_basis.m_el[1].m_floats._0_8_ = *(undefined8 *)pbVar2->m_floats;
    local_b8.m_basis.m_el[1].m_floats._8_8_ =
         *(undefined8 *)((body0->m_worldTransform).m_basis.m_el[1].m_floats + 2);
    local_b8.m_basis.m_el[2].m_floats._0_8_ = *(undefined8 *)pbVar3->m_floats;
    local_b8.m_basis.m_el[2].m_floats._8_8_ =
         *(undefined8 *)((body0->m_worldTransform).m_basis.m_el[2].m_floats + 2);
    local_b8.m_origin.m_floats._0_8_ = *(undefined8 *)pbVar4->m_floats;
    local_b8.m_origin.m_floats._8_8_ =
         *(undefined8 *)((body0->m_worldTransform).m_origin.m_floats + 2);
    btTransform::operator*
              (&local_70,&local_b8,(btTransform *)((long)pbVar6[1].m_userPointer + uVar10));
    body0->m_updateRevision = body0->m_updateRevision + 1;
    *(undefined8 *)(pbVar1->m_basis).m_el[0].m_floats = local_70.m_basis.m_el[0].m_floats._0_8_;
    *(undefined8 *)((body0->m_worldTransform).m_basis.m_el[0].m_floats + 2) =
         local_70.m_basis.m_el[0].m_floats._8_8_;
    *(undefined8 *)pbVar2->m_floats = local_70.m_basis.m_el[1].m_floats._0_8_;
    *(undefined8 *)((body0->m_worldTransform).m_basis.m_el[1].m_floats + 2) =
         local_70.m_basis.m_el[1].m_floats._8_8_;
    *(undefined8 *)pbVar3->m_floats = local_70.m_basis.m_el[2].m_floats._0_8_;
    *(undefined8 *)((body0->m_worldTransform).m_basis.m_el[2].m_floats + 2) =
         local_70.m_basis.m_el[2].m_floats._8_8_;
    pbVar4->m_floats[0] = local_70.m_origin.m_floats[0];
    (body0->m_worldTransform).m_origin.m_floats[1] = local_70.m_origin.m_floats[1];
    (body0->m_worldTransform).m_origin.m_floats[2] = local_70.m_origin.m_floats[2];
    (body0->m_worldTransform).m_origin.m_floats[3] = local_70.m_origin.m_floats[3];
    pbVar7 = (this->m_childCollisionAlgorithms).m_data[uVar9];
    (*pbVar7->_vptr_btCollisionAlgorithm[3])(pbVar7,body0,pbVar11,dispatchInfo,resultOut);
    body0->m_updateRevision = body0->m_updateRevision + 1;
    fVar13 = extraout_XMM0_Da;
    if (bVar12 <= extraout_XMM0_Da) {
      fVar13 = bVar12;
    }
    *(undefined8 *)(pbVar1->m_basis).m_el[0].m_floats = local_b8.m_basis.m_el[0].m_floats._0_8_;
    *(undefined8 *)((body0->m_worldTransform).m_basis.m_el[0].m_floats + 2) =
         local_b8.m_basis.m_el[0].m_floats._8_8_;
    *(undefined8 *)pbVar2->m_floats = local_b8.m_basis.m_el[1].m_floats._0_8_;
    *(undefined8 *)((body0->m_worldTransform).m_basis.m_el[1].m_floats + 2) =
         local_b8.m_basis.m_el[1].m_floats._8_8_;
    *(undefined8 *)pbVar3->m_floats = local_b8.m_basis.m_el[2].m_floats._0_8_;
    *(undefined8 *)((body0->m_worldTransform).m_basis.m_el[2].m_floats + 2) =
         local_b8.m_basis.m_el[2].m_floats._8_8_;
    *(undefined8 *)pbVar4->m_floats = local_b8.m_origin.m_floats._0_8_;
    *(undefined8 *)((body0->m_worldTransform).m_origin.m_floats + 2) =
         local_b8.m_origin.m_floats._8_8_;
    uVar10 = uVar10 + 0x58;
    bVar12 = fVar13;
  }
  return bVar12;
}

Assistant:

btScalar	btCompoundCollisionAlgorithm::calculateTimeOfImpact(btCollisionObject* body0,btCollisionObject* body1,const btDispatcherInfo& dispatchInfo,btManifoldResult* resultOut)
{
	btAssert(0);
	//needs to be fixed, using btCollisionObjectWrapper and NOT modifying internal data structures
	btCollisionObject* colObj = m_isSwapped? body1 : body0;
	btCollisionObject* otherObj = m_isSwapped? body0 : body1;

	btAssert (colObj->getCollisionShape()->isCompound());
	
	btCompoundShape* compoundShape = static_cast<btCompoundShape*>(colObj->getCollisionShape());

	//We will use the OptimizedBVH, AABB tree to cull potential child-overlaps
	//If both proxies are Compound, we will deal with that directly, by performing sequential/parallel tree traversals
	//given Proxy0 and Proxy1, if both have a tree, Tree0 and Tree1, this means:
	//determine overlapping nodes of Proxy1 using Proxy0 AABB against Tree1
	//then use each overlapping node AABB against Tree0
	//and vise versa.

	btScalar hitFraction = btScalar(1.);

	int numChildren = m_childCollisionAlgorithms.size();
	int i;
    btTransform	orgTrans;
    btScalar frac;
	for (i=0;i<numChildren;i++)
	{
		//btCollisionShape* childShape = compoundShape->getChildShape(i);

		//backup
        orgTrans = colObj->getWorldTransform();
	
		const btTransform& childTrans = compoundShape->getChildTransform(i);
		//btTransform	newChildWorldTrans = orgTrans*childTrans ;
		colObj->setWorldTransform( orgTrans*childTrans );

		//btCollisionShape* tmpShape = colObj->getCollisionShape();
		//colObj->internalSetTemporaryCollisionShape( childShape );
        frac = m_childCollisionAlgorithms[i]->calculateTimeOfImpact(colObj,otherObj,dispatchInfo,resultOut);
		if (frac<hitFraction)
		{
			hitFraction = frac;
		}
		//revert back
		//colObj->internalSetTemporaryCollisionShape( tmpShape);
		colObj->setWorldTransform( orgTrans);
	}
	return hitFraction;

}